

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::solve_equality
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this)

{
  pointer *ppnVar1;
  uint uVar2;
  pointer pnVar3;
  pointer pcVar4;
  undefined8 uVar5;
  bool bVar6;
  pointer piVar7;
  ptrdiff_t _Num;
  long lVar8;
  ulong uVar9;
  float fVar10;
  
  piVar7 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->items).
                super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)piVar7;
  this->lower_bound = INFINITY;
  if (lVar8 == 0) {
    fVar10 = 0.0;
  }
  else {
    lVar8 = (lVar8 >> 3) * -0x5555555555555555;
    fVar10 = 0.0;
    do {
      uVar5 = vcmpss_avx512f(ZEXT416((uint)piVar7->r),ZEXT816(0) << 0x40,1);
      bVar6 = (bool)((byte)uVar5 & 1);
      fVar10 = (float)((uint)bVar6 * (int)(fVar10 + piVar7->r) + (uint)!bVar6 * (int)fVar10);
      piVar7 = piVar7 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  this->upper_bound = fVar10;
  make_init_node_0(this);
  pnVar3 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pnVar3[-1].sumfactor == this->b_min) {
    this->upper_bound = pnVar3[-1].sumr;
    uVar9 = (ulong)(this->subvector).m_element_size;
    if (uVar9 != 0) {
      pcVar4 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar4 + this->solution,pcVar4 + pnVar3[-1].variables,uVar9);
    }
    uVar2 = (this->nodes).
            super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].variables;
    shared_subvector::check_index(&this->subvector,uVar2);
    *(size_type *)
     ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
      _M_impl.super__Vector_impl_data._M_start + uVar2) = (this->subvector).m_free_list_head;
    (this->subvector).m_free_list_head = uVar2;
  }
  else {
    make_init_node_1(this);
    pnVar3 = (this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pnVar3[-1].sumfactor == this->b_min) {
      this->upper_bound = pnVar3[-1].sumr;
      uVar9 = (ulong)(this->subvector).m_element_size;
      if (uVar9 != 0) {
        pcVar4 = (this->subvector).m_container.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memmove(pcVar4 + this->solution,pcVar4 + pnVar3[-1].variables,uVar9);
      }
      uVar2 = (this->nodes).
              super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar2);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar2) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar2;
      ppnVar1 = &(this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppnVar1 = *ppnVar1 + -1;
    }
    while ((this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      make_next_equality_node(this);
    }
  }
  return;
}

Assistant:

void solve_equality()
    {
        lower_bound = compute_lower_bound();
        upper_bound = compute_upper_bound();

        make_init_node_0();
        if (nodes.back().sumfactor == b_min) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
            subvector.remove(nodes.back().variables);
            return;
        }

        make_init_node_1();
        if (nodes.back().sumfactor == b_min) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        while (!nodes.empty())
            make_next_equality_node();
    }